

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

value_type * __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>::
update(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
       *this,char_range key)

{
  plain_fkhash_nlm<int> *this_00;
  uint32_t uVar1;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var2;
  bool bVar3;
  bool bVar4;
  _Head_base<0UL,_unsigned_char_*,_false> in_RAX;
  undefined8 *puVar5;
  char *pcVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t node_id;
  char_range local_220;
  uint64_t local_210;
  _Head_base<0UL,_unsigned_char_*,_false> local_208;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  local_200;
  
  local_220.end = key.end;
  local_220.begin = key.begin;
  if (local_220.begin == local_220.end) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = &PTR__exception_00185a10;
    pcVar6 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_220.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_200,0,0x20);
          operator=(this,&local_200);
          std::
          vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ::~vector(&local_200.label_store_.ptrs_);
          plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
                    (&local_200.hash_trie_);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        local_208._M_head_impl =
             (uchar *)plain_fkhash_nlm<int>::append(&this->label_store_,&local_220);
      }
      else {
        local_210 = 0;
        this_00 = &this->label_store_;
        do {
          if (local_220.begin == local_220.end) {
            return (value_type *)
                   (_Head_base<0UL,_unsigned_char_*,_false>)
                   *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
                    &(this->label_store_).ptrs_.
                     super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_210]._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          }
          _Var2.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (this_00->ptrs_).
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_210]._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          uVar9 = (long)local_220.end - (long)local_220.begin;
          if (uVar9 != 0) {
            uVar8 = 0;
            do {
              if (local_220.begin[uVar8] !=
                  *(byte *)((long)_Var2.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                           uVar8)) {
                local_208._M_head_impl = (uchar *)0x0;
                goto LAB_001666a5;
              }
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          local_208._M_head_impl =
               (uchar *)((long)_Var2.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar9);
          uVar8 = uVar9;
LAB_001666a5:
          if ((value_type_conflict7 *)local_208._M_head_impl == (value_type_conflict7 *)0x0) {
            local_220.begin = local_220.begin + uVar8;
            local_208._M_head_impl = in_RAX._M_head_impl;
            if (this->lambda_ <= uVar8) {
              do {
                bVar3 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                  (&this->hash_trie_,&local_210,0xff);
                if (bVar3) {
                  local_200.is_ready_ = false;
                  local_200._1_7_ = 0;
                  std::
                  vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
                  ::emplace_back<decltype(nullptr)>
                            ((vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
                              *)this_00,(void **)&local_200);
                }
                uVar8 = uVar8 - this->lambda_;
              } while (this->lambda_ <= uVar8);
            }
            if ((this->codes_)._M_elems[*local_220.begin] == 0xff) {
              uVar1 = this->num_codes_;
              uVar7 = uVar1 + 1;
              this->num_codes_ = uVar7;
              (this->codes_)._M_elems[*local_220.begin] = (uchar)uVar1;
              if (uVar7 == 0xff) {
                puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar5 = &PTR__exception_00185a10;
                pcVar6 = 
                "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
                ;
                goto LAB_00166859;
              }
            }
            bVar4 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                              (&this->hash_trie_,&local_210,
                               uVar8 << 8 | (ulong)(this->codes_)._M_elems[*local_220.begin]);
            local_220.begin = local_220.begin + 1;
            bVar3 = true;
            if (bVar4) {
              this->size_ = this->size_ + 1;
              local_208._M_head_impl = (uchar *)plain_fkhash_nlm<int>::append(this_00,&local_220);
              bVar3 = false;
            }
          }
          else {
            bVar3 = false;
          }
          in_RAX._M_head_impl = local_208._M_head_impl;
        } while (bVar3);
      }
      return (value_type *)local_208._M_head_impl;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = &PTR__exception_00185a10;
    pcVar6 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_00166859:
  puVar5[1] = pcVar6;
  __cxa_throw(puVar5,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }